

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VertexClustering::input(VertexClustering *this,string *filePath)

{
  map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_> *this_00;
  VertexGroup *this_01;
  int iVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  VCFace *pVVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  int __tmp;
  long lVar8;
  key_type *__k;
  pointer this_02;
  double x_00;
  double z_00;
  int c;
  int b;
  char _;
  double z;
  double y;
  double x;
  vector<VCEdge,_std::allocator<VCEdge>_> edges;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces;
  char s [256];
  int local_214;
  int local_210;
  undefined1 local_209;
  int local_208;
  undefined4 uStack_204;
  VCFace *local_200;
  key_type local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  _Vector_base<VCEdge,_std::allocator<VCEdge>_> local_1d8;
  VertexClustering *local_1c0;
  FILE *local_1b8;
  _Base_ptr local_1b0;
  _Vector_base<VCFace_*,_std::allocator<VCFace_*>_> local_1a8;
  Vertex local_188;
  char local_138 [264];
  
  local_1b8 = fopen((filePath->_M_dataplus)._M_p,"r");
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_start = (VCEdge *)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (VCEdge *)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->edgeMap;
  local_1b0 = &(this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1c0 = this;
  while (pcVar3 = fgets(local_138,0x100,local_1b8), pcVar3 != (char *)0x0) {
    if (local_138[0] == 'f') {
      this->cntFace = this->cntFace + 1;
      __isoc99_sscanf(local_138,"%c%d%d%d",&local_209,&local_208,&local_210,&local_214);
      iVar1 = local_210;
      if (local_214 < local_210) {
        local_210 = local_214;
        local_214 = iVar1;
      }
      iVar1 = local_210;
      if (local_210 < local_208) {
        local_210 = local_208;
        local_208 = iVar1;
      }
      iVar1 = local_214;
      if (local_214 < local_210) {
        iVar1 = local_210;
        local_210 = local_214;
      }
      local_214 = iVar1;
      Vertex::addNeighborVertex
                ((Vertex *)(&this->vGroup->field_0x0 + (long)local_208 * 0x50),local_210);
      Vertex::addNeighborVertex
                ((Vertex *)(&this->vGroup->field_0x0 + (long)local_208 * 0x50),local_214);
      Vertex::addNeighborVertex
                ((Vertex *)(&this->vGroup->field_0x0 + (long)local_210 * 0x50),local_208);
      Vertex::addNeighborVertex
                ((Vertex *)(&this->vGroup->field_0x0 + (long)local_210 * 0x50),local_214);
      Vertex::addNeighborVertex
                ((Vertex *)(&this->vGroup->field_0x0 + (long)local_214 * 0x50),local_208);
      Vertex::addNeighborVertex
                ((Vertex *)(&this->vGroup->field_0x0 + (long)local_214 * 0x50),local_210);
      pVVar5 = (VCFace *)operator_new(0x150);
      VCFace::VCFace(pVVar5,local_208,local_210,local_214,this->vGroup,
                     *(this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      local_200 = pVVar5;
      std::vector<VCFace_*,_std::allocator<VCFace_*>_>::push_back
                ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)&local_1a8,&local_200);
      local_1f8.a = local_208;
      local_1f8.b = local_210;
      local_1f0 = local_208;
      local_1ec = local_214;
      local_1e8 = local_210;
      local_1e4 = local_214;
      for (lVar8 = 0; this = local_1c0, lVar8 != 0x18; lVar8 = lVar8 + 8) {
        __k = (key_type *)((long)&local_1f8.a + lVar8);
        iVar6 = std::
                _Rb_tree<VCPair,_std::pair<const_VCPair,_VCEdge>,_std::_Select1st<std::pair<const_VCPair,_VCEdge>_>,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                ::find(&this_00->_M_t,__k);
        pVVar5 = local_200;
        if (iVar6._M_node == local_1b0) {
          pmVar7 = std::
                   map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                   ::operator[](this_00,__k);
          pmVar7->f1 = pVVar5;
          pmVar7->f2 = (VCFace *)0x0;
        }
        else {
          iVar6._M_node[1]._M_left = (_Base_ptr)local_200;
          VCFace::addNeighbor((VCFace *)iVar6._M_node[1]._M_parent,local_200);
          VCFace::addNeighbor(local_200,(VCFace *)iVar6._M_node[1]._M_parent);
          std::vector<VCEdge,_std::allocator<VCEdge>_>::push_back
                    ((vector<VCEdge,_std::allocator<VCEdge>_> *)&local_1d8,
                     (value_type *)&iVar6._M_node[1]._M_parent);
        }
      }
    }
    else if (local_138[0] == 'v') {
      __isoc99_sscanf(local_138,"%c%lf%lf%lf",&local_209,&local_1f8,&local_200,&local_208);
      x_00 = (double)CONCAT44(local_1f8.b,local_1f8.a);
      if (((NAN(x_00)) || (NAN((double)local_200))) ||
         (z_00 = (double)CONCAT44(uStack_204,local_208), NAN(z_00))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"warning: nan vertex in input");
        std::endl<char,std::char_traits<char>>(poVar4);
        x_00 = (double)CONCAT44(local_1f8.b,local_1f8.a);
        z_00 = (double)CONCAT44(uStack_204,local_208);
      }
      this_01 = this->vGroup;
      Vertex::Vertex(&local_188,x_00,(double)local_200,z_00);
      VertexGroup::addVertex(this_01,&local_188);
      Vertex::~Vertex(&local_188);
    }
  }
  if ((this->opts).adaptive == true) {
    calcCurvature(this,(vector<VCFace_*,_std::allocator<VCFace_*>_> *)&local_1a8);
  }
  initClusters(this,(vector<VCEdge,_std::allocator<VCEdge>_> *)&local_1d8);
  for (this_02 = local_1d8._M_impl.super__Vector_impl_data._M_start;
      this_02 != local_1d8._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
    bVar2 = VCEdge::isBoundary(this_02);
    if (bVar2) {
      std::deque<VCEdge,_std::allocator<VCEdge>_>::push_back(&(this->boundary).c,this_02);
    }
  }
  std::_Vector_base<VCFace_*,_std::allocator<VCFace_*>_>::~_Vector_base(&local_1a8);
  std::_Vector_base<VCEdge,_std::allocator<VCEdge>_>::~_Vector_base(&local_1d8);
  return;
}

Assistant:

void VertexClustering::input(const string& filePath)
{
	FILE* f = fopen(filePath.c_str(), "r");
	int cntv = 0, cntf = 0;
	char s[256], _;
	vector<VCEdge> edges;
	vector<VCFace *> faces;

	while (fgets(s, sizeof s, f) != NULL) {
		switch (s[0]) {
		case '#': break; 
		case 'v': {
			cntv++;
			double x, y, z;
			sscanf(s, "%c%lf%lf%lf", &_, &x, &y, &z);
			if (x != x || y != y || z != z) {
				cout << "warning: nan vertex in input" << endl;
			}
			vGroup->addVertex(Vertex(x, y, z));
			break;
		}
		case 'f': {
			cntf++;
			cntFace++;
			int a, b, c;
			sscanf(s, "%c%d%d%d",&_, &a, &b, &c);
			VCSort3(a, b, c);
			vGroup->group[a].addNeighborVertex(b);
			vGroup->group[a].addNeighborVertex(c);
			vGroup->group[b].addNeighborVertex(a);
			vGroup->group[b].addNeighborVertex(c);
			vGroup->group[c].addNeighborVertex(a);
			vGroup->group[c].addNeighborVertex(b);
			VCFace* f = new VCFace(a, b, c, vGroup, clusters[0]); //face pointers tracked by clusters
			faces.push_back(f);
			VCPair pairs[3] = { VCPair(a,b), VCPair(a,c), VCPair(b,c) };
			for (int i = 0; i < 3; ++i) {
				auto iter = edgeMap.find(pairs[i]);
				if (iter != edgeMap.end()) {
					iter->second.f2 = f;
					iter->second.f1->addNeighbor(f);
					f->addNeighbor(iter->second.f1);
					edges.push_back(iter->second);
				}
				else {
					edgeMap[pairs[i]] = VCEdge(f, NULL);
				}
			}
			break;
		}
		default: break;
		}
	}
	if(opts.adaptive)
		calcCurvature(faces); //only uniform remeshing can skip this step
	initClusters(edges);
	for (auto e = edges.begin(); e != edges.end(); ++e) {
		if (e->isBoundary())
			boundary.push(*e);
	}
}